

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3.c
# Opt level: O2

int main(void)

{
  float fVar1;
  
  printf("%5s\t%6s\n","Fahr","Celc");
  for (fVar1 = 0.0; fVar1 <= 300.0; fVar1 = fVar1 + 20.0) {
    printf("%5.0f\t%6.1f\n",(double)fVar1,
           (double)(float)(((double)fVar1 + -32.0) * 0.5555555555555556));
  }
  return 0;
}

Assistant:

int main()
{
    float fahr, celcius;
    int lower, upper, step;

    lower = 0;
    upper = 300;
    step = 20;

    fahr = lower;

    printf("%5s\t%6s\n", "Fahr", "Celc");
    while (fahr <= upper) {
        celcius = (5.0/9.0) * (fahr - 32.0);
        printf("%5.0f\t%6.1f\n", fahr, celcius);
        fahr = fahr + step;
    }
}